

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  size_t in_RCX;
  undefined1 local_78 [8];
  Pl_DCT p;
  Pl_Discard discard;
  FuzzHelper *this_local;
  
  Pl_DCT::setMemoryLimit(200000000);
  Pl_DCT::setScanLimit(0x32);
  Pl_DCT::setThrowOnCorruptData(true);
  Pl_Discard::Pl_Discard((Pl_Discard *)&p.m);
  Pl_DCT::Pl_DCT((Pl_DCT *)local_78,"decode",(Pipeline *)&p.m);
  Pl_DCT::write((Pl_DCT *)local_78,(int)this->data,(void *)this->size,in_RCX);
  Pl_DCT::finish((Pl_DCT *)local_78);
  Pl_DCT::~Pl_DCT((Pl_DCT *)local_78);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&p.m);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    // Limit the memory used to decompress JPEG files during fuzzing. Excessive memory use during
    // fuzzing is due to corrupt JPEG data which sometimes cannot be detected before
    // jpeg_start_decompress is called. During normal use of qpdf very large JPEGs can occasionally
    // occur legitimately and therefore must be allowed during normal operations.
    Pl_DCT::setMemoryLimit(200'000'000);
    Pl_DCT::setScanLimit(50);

    // Do not decompress corrupt data. This may cause extended runtime within jpeglib without
    // exercising additional code paths in qpdf.
    Pl_DCT::setThrowOnCorruptData(true);

    Pl_Discard discard;
    Pl_DCT p("decode", &discard);
    p.write(const_cast<unsigned char*>(data), size);
    p.finish();
}